

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O2

int __thiscall QtMWidgets::Section::maxWidth(Section *this,QStyleOption *opt)

{
  Type TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  QStyleOption *pQVar5;
  uint uVar6;
  int i;
  QLocale local_98 [8];
  ulong local_90;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QTime local_3c;
  QDate local_38;
  
  QDate::QDate(&local_38,7999,0xc,0x1f);
  QTime::QTime(&local_3c,0x17,0x3b,0x3b,999);
  QDateTime::QDateTime((QDateTime *)&local_58,local_38,local_3c,LocalTime,0);
  value((QString *)&local_88,this,(QDateTime *)&local_58);
  pQVar5 = opt + 0x20;
  iVar2 = QFontMetrics::boundingRect((QString *)pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  QDateTime::~QDateTime((QDateTime *)&local_58);
  iVar3 = QFontMetrics::averageCharWidth();
  uVar6 = (extraout_EDX - iVar2) + iVar3 / 3 + 1;
  local_90 = (ulong)uVar6;
  TVar1 = this->type;
  if (TVar1 == DaySectionShort) {
    iVar2 = 0;
    for (iVar3 = 1; iVar3 != 8; iVar3 = iVar3 + 1) {
      QLocale::system();
      QLocale::dayName((int)&local_58,(FormatType)local_98);
      operator+((QString *)&local_88,(QString *)&local_58,(QChar)0x20);
      iVar4 = QFontMetrics::boundingRect((QString *)pQVar5);
      iVar4 = (extraout_EDX_03 - iVar4) + 1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QLocale::~QLocale(local_98);
      if (iVar2 < iVar4) {
        iVar2 = iVar4;
      }
    }
    QLocale::system();
    QLocale::dayName((int)&local_70,(FormatType)&local_88);
    QLocale::~QLocale((QLocale *)&local_88);
    iVar3 = QFontMetrics::boundingRect((QString *)pQVar5);
    iVar2 = extraout_EDX_07;
  }
  else {
    if (TVar1 != DaySectionLong) {
      if (TVar1 == MonthSectionShort) {
        iVar2 = 0;
        for (iVar3 = 1; iVar3 != 0xd; iVar3 = iVar3 + 1) {
          QLocale::system();
          QLocale::monthName((int)&local_58,(FormatType)local_98);
          operator+((QString *)&local_88,(QString *)&local_58,(QChar)0x20);
          iVar4 = QFontMetrics::boundingRect((QString *)pQVar5);
          iVar4 = (extraout_EDX_02 - iVar4) + 1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QLocale::~QLocale(local_98);
          if (iVar2 < iVar4) {
            iVar2 = iVar4;
          }
        }
        QLocale::system();
        QLocale::monthName((int)&local_70,(FormatType)&local_88);
        QLocale::~QLocale((QLocale *)&local_88);
        iVar3 = QFontMetrics::boundingRect((QString *)pQVar5);
        iVar4 = (int)local_90;
        iVar2 = extraout_EDX_06;
      }
      else {
        if (TVar1 != MonthSectionLong) {
          return uVar6;
        }
        iVar3 = 0;
        for (iVar2 = 1; iVar2 != 0xd; iVar2 = iVar2 + 1) {
          QLocale::system();
          QLocale::monthName((int)&local_58,(FormatType)local_98);
          operator+((QString *)&local_88,(QString *)&local_58,(QChar)0x20);
          iVar4 = QFontMetrics::boundingRect((QString *)pQVar5);
          iVar4 = (extraout_EDX_00 - iVar4) + 1;
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
          QLocale::~QLocale(local_98);
          if (iVar3 < iVar4) {
            iVar3 = iVar4;
          }
        }
        QLocale::system();
        QLocale::monthName((int)&local_70,(FormatType)&local_88);
        QLocale::~QLocale((QLocale *)&local_88);
        iVar3 = QFontMetrics::boundingRect((QString *)pQVar5);
        iVar4 = (int)local_90;
        iVar2 = extraout_EDX_05;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
      return ((iVar4 + iVar2) - iVar3) + 1;
    }
    iVar3 = 0;
    for (iVar2 = 1; iVar2 != 8; iVar2 = iVar2 + 1) {
      QLocale::system();
      QLocale::dayName((int)&local_58,(FormatType)local_98);
      operator+((QString *)&local_88,(QString *)&local_58,(QChar)0x20);
      iVar4 = QFontMetrics::boundingRect((QString *)pQVar5);
      iVar4 = (extraout_EDX_01 - iVar4) + 1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      QLocale::~QLocale(local_98);
      if (iVar3 < iVar4) {
        iVar3 = iVar4;
      }
    }
    QLocale::system();
    QLocale::dayName((int)&local_70,(FormatType)&local_88);
    QLocale::~QLocale((QLocale *)&local_88);
    iVar3 = QFontMetrics::boundingRect((QString *)pQVar5);
    iVar2 = extraout_EDX_04;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  iVar4 = QFontMetrics::averageCharWidth();
  return (((int)local_90 + iVar2) - iVar3) + iVar4 + 1;
}

Assistant:

int
Section::maxWidth( const QStyleOption & opt ) const
{
	int width = opt.fontMetrics.boundingRect( value(
		DATETIMEPICKER_DATETIME_MAX ) ).width();

	width += opt.fontMetrics.averageCharWidth() / 3;

	switch( type )
	{
		case DaySectionShort :
		{
			width += opt.fontMetrics.boundingRect( maxShortDay( opt ) ).width();
			width += opt.fontMetrics.averageCharWidth();
		}
		break;

		case DaySectionLong :
		{
			width += opt.fontMetrics.boundingRect( maxLongDay( opt ) ).width();
			width += opt.fontMetrics.averageCharWidth();
		}
		break;

		case MonthSectionShort :
			width += opt.fontMetrics.boundingRect( maxShortMonth( opt ) ).width();
		break;

		case MonthSectionLong :
			width += opt.fontMetrics.boundingRect( maxLongMonth( opt ) ).width();
		break;

		default:
			break;
	}

	return width;
}